

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageinfo.cxx
# Opt level: O0

string * vigra::detail::trimString(string *s)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var1;
  char *pcVar2;
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t end;
  uint begin;
  undefined5 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 uVar3;
  undefined1 in_stack_ffffffffffffff87;
  bool local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb0;
  allocator<char> local_41;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  char *local_28;
  long local_20;
  uint local_14;
  ulong local_10;
  
  local_14 = 0;
  this_00 = in_RDI;
  local_10 = in_RSI;
  while( true ) {
    this = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(ulong)local_14;
    p_Var1 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::__cxx11::string::size();
    local_69 = false;
    if (this < p_Var1) {
      pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
      in_stack_ffffffffffffff87 = true;
      local_69 = (bool)in_stack_ffffffffffffff87;
      if (*pcVar2 != ' ') {
        pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
        in_stack_ffffffffffffff87 = *pcVar2 == '\t';
        local_69 = (bool)in_stack_ffffffffffffff87;
      }
    }
    if (local_69 == false) break;
    local_14 = local_14 + 1;
  }
  local_20 = std::__cxx11::string::size();
  while( true ) {
    uVar3 = false;
    if (local_20 != 0) {
      pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
      in_stack_ffffffffffffff85 = true;
      uVar3 = in_stack_ffffffffffffff85;
      if (*pcVar2 != ' ') {
        pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
        in_stack_ffffffffffffff85 = *pcVar2 == '\t';
        uVar3 = in_stack_ffffffffffffff85;
      }
    }
    if ((bool)uVar3 == false) break;
    local_20 = local_20 + -1;
  }
  local_30 = std::__cxx11::string::begin();
  local_28 = (char *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(this,CONCAT17(in_stack_ffffffffffffff87,
                                               CONCAT16(uVar3,CONCAT15(in_stack_ffffffffffffff85,
                                                                       in_stack_ffffffffffffff80))))
  ;
  local_40 = std::__cxx11::string::begin();
  local_38 = (char *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(this,CONCAT17(in_stack_ffffffffffffff87,
                                               CONCAT16(uVar3,CONCAT15(in_stack_ffffffffffffff85,
                                                                       in_stack_ffffffffffffff80))))
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            (this_00,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator(&local_41);
  return this_00;
}

Assistant:

std::string trimString(const std::string &s)
{
    unsigned int begin = 0;
    while(begin < s.size() && ((s[begin] == ' ') || (s[begin] == '\t')))
        ++begin;
    std::size_t end = s.size();
    while(end > 0 && ((s[end-1] == ' ') || (s[end-1] == '\t')))
        --end;
    return std::string(s.begin() + begin, s.begin() + end);
}